

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O0

void AddInputs(CMutableTransaction *rawTx,UniValue *inputs_in,optional<bool> rbf)

{
  string_view strKey;
  string_view key;
  string_view key_00;
  COutPoint prevoutIn;
  bool bVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  int iVar4;
  size_t sVar5;
  UniValue *pUVar6;
  undefined8 uVar7;
  UniValue *this;
  long in_FS_OFFSET;
  int64_t seqNr64;
  UniValue *sequenceObj;
  uint32_t nSequence;
  int nOutput;
  UniValue *vout_v;
  UniValue *o;
  UniValue *input;
  uint idx;
  CTxIn in;
  Txid txid;
  UniValue inputs;
  CTxIn *in_stack_fffffffffffffc48;
  value_type *in_stack_fffffffffffffc50;
  UniValue *in_stack_fffffffffffffc58;
  UniValue *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  UniValue *in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  uint32_t in_stack_fffffffffffffc8c;
  string *message;
  CScript *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  UniValue *in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcb8;
  undefined8 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  uint32_t in_stack_fffffffffffffcd0;
  uint local_290;
  string local_269 [2];
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  CTxIn *local_208;
  value_type *pvStack_200;
  UniValue *local_1f8;
  UniValue *pUStack_1f0;
  undefined4 local_1e8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::UniValue((UniValue *)in_stack_fffffffffffffc48);
  bVar1 = UniValue::isNull((UniValue *)in_stack_fffffffffffffc48);
  if (bVar1) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc60);
    UniValue::UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                       (VType)((ulong)in_stack_fffffffffffffc60 >> 0x20),
                       (string *)in_stack_fffffffffffffc58);
    UniValue::operator=(in_stack_fffffffffffffc58,(UniValue *)in_stack_fffffffffffffc50);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffffc48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
  }
  else {
    UniValue::get_array((UniValue *)in_stack_fffffffffffffc50);
    UniValue::operator=(in_stack_fffffffffffffc58,(UniValue *)in_stack_fffffffffffffc50);
  }
  local_290 = 0;
  do {
    sVar5 = UniValue::size((UniValue *)in_stack_fffffffffffffc48);
    if (sVar5 <= local_290) {
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffffc48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
LAB_019a50c2:
      __stack_chk_fail();
    }
    UniValue::operator[](in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58);
    pUVar6 = UniValue::get_obj((UniValue *)in_stack_fffffffffffffc50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
               (char *)in_stack_fffffffffffffc60);
    strKey._M_str._0_4_ = in_stack_fffffffffffffc88;
    strKey._M_len = in_stack_fffffffffffffc80;
    strKey._M_str._4_4_ = in_stack_fffffffffffffc8c;
    ParseHashO(in_stack_fffffffffffffc58,strKey);
    transaction_identifier<false>::FromUint256((uint256 *)in_stack_fffffffffffffc48);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
               (char *)in_stack_fffffffffffffc60);
    key._M_str._0_4_ = in_stack_fffffffffffffc98;
    key._M_len = (size_t)in_stack_fffffffffffffc90;
    key._M_str._4_4_ = in_stack_fffffffffffffc9c;
    UniValue::find_value(in_stack_fffffffffffffc70,key);
    bVar1 = UniValue::isNum((UniValue *)in_stack_fffffffffffffc48);
    if (!bVar1) {
      uVar3 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                 (char *)in_stack_fffffffffffffc90,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      JSONRPCError(in_stack_fffffffffffffc9c,
                   (string *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_019a50c2;
    }
    iVar4 = UniValue::getInt<int>(in_stack_fffffffffffffca0);
    if (iVar4 < 0) {
      uVar7 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                 (char *)in_stack_fffffffffffffc90,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      JSONRPCError(in_stack_fffffffffffffc9c,
                   (string *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar7,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_019a50c2;
    }
    local_269[0].field_2._M_local_buf[6] = '\x01';
    uVar2 = std::optional<bool>::value_or<bool>
                      ((optional<bool> *)in_stack_fffffffffffffc60,(bool *)in_stack_fffffffffffffc58
                      );
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
               (char *)in_stack_fffffffffffffc60);
    key_00._M_str._0_4_ = in_stack_fffffffffffffc98;
    key_00._M_len = (size_t)in_stack_fffffffffffffc90;
    key_00._M_str._4_4_ = in_stack_fffffffffffffc9c;
    this = UniValue::find_value(in_stack_fffffffffffffc70,key_00);
    bVar1 = UniValue::isNum((UniValue *)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc9c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc9c);
    in_stack_fffffffffffffca0 = pUVar6;
    if ((bVar1) &&
       ((in_stack_fffffffffffffc90 = (CScript *)UniValue::getInt<long>(this),
        (long)in_stack_fffffffffffffc90 < 0 ||
        (in_stack_fffffffffffffca0 = pUVar6, 0xffffffff < (long)in_stack_fffffffffffffc90)))) {
      uVar7 = __cxa_allocate_exception(0x58);
      message = local_269;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                 (char *)in_stack_fffffffffffffc90,(allocator<char> *)message);
      JSONRPCError(in_stack_fffffffffffffc9c,message);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar7,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_019a50c2;
    }
    COutPoint::COutPoint
              ((COutPoint *)in_stack_fffffffffffffc58,(Txid *)in_stack_fffffffffffffc50,
               (uint32_t)((ulong)in_stack_fffffffffffffc48 >> 0x20));
    local_218 = 0;
    uStack_210 = 0;
    local_228 = 0;
    uStack_220 = 0;
    CScript::CScript((CScript *)in_stack_fffffffffffffc48);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = uVar2;
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
         (char)in_stack_fffffffffffffcb0;
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
         (char)((uint7)in_stack_fffffffffffffcb0 >> 8);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
         (char)((uint7)in_stack_fffffffffffffcb0 >> 0x10);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
         (char)((uint7)in_stack_fffffffffffffcb0 >> 0x18);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
         (char)((uint7)in_stack_fffffffffffffcb0 >> 0x20);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
         (char)((uint7)in_stack_fffffffffffffcb0 >> 0x28);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
         (char)((uint7)in_stack_fffffffffffffcb0 >> 0x30);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
         (char)in_stack_fffffffffffffcb8;
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
         (char)((ulong)in_stack_fffffffffffffcb8 >> 8);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
         (char)((ulong)in_stack_fffffffffffffcb8 >> 0x10);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
         (char)((ulong)in_stack_fffffffffffffcb8 >> 0x18);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
         (char)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
         (char)((ulong)in_stack_fffffffffffffcb8 >> 0x28);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
         (char)((ulong)in_stack_fffffffffffffcb8 >> 0x30);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
         (char)((ulong)in_stack_fffffffffffffcb8 >> 0x38);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
         (char)in_stack_fffffffffffffcc0;
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
         (char)((ulong)in_stack_fffffffffffffcc0 >> 8);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
         (char)((ulong)in_stack_fffffffffffffcc0 >> 0x10);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
         (char)((ulong)in_stack_fffffffffffffcc0 >> 0x18);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
         (char)((ulong)in_stack_fffffffffffffcc0 >> 0x20);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
         (char)((ulong)in_stack_fffffffffffffcc0 >> 0x28);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
         (char)((ulong)in_stack_fffffffffffffcc0 >> 0x30);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
         (char)((ulong)in_stack_fffffffffffffcc0 >> 0x38);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
         (char)in_stack_fffffffffffffcc8;
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
         (char)((uint)in_stack_fffffffffffffcc8 >> 8);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
         (char)((uint)in_stack_fffffffffffffcc8 >> 0x10);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
         (char)((uint)in_stack_fffffffffffffcc8 >> 0x18);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)iVar4;
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((uint)iVar4 >> 8);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
         (char)((uint)iVar4 >> 0x10);
    prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
         (char)((uint)iVar4 >> 0x18);
    prevoutIn.n = in_stack_fffffffffffffcd0;
    in_stack_fffffffffffffc48 = local_208;
    in_stack_fffffffffffffc50 = pvStack_200;
    in_stack_fffffffffffffc58 = local_1f8;
    in_stack_fffffffffffffc60 = pUStack_1f0;
    in_stack_fffffffffffffc68 = local_1e8;
    CTxIn::CTxIn((CTxIn *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),prevoutIn,
                 in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
    CScript::~CScript((CScript *)in_stack_fffffffffffffc48);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::push_back
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffc58,
               in_stack_fffffffffffffc50);
    CTxIn::~CTxIn(in_stack_fffffffffffffc48);
    local_290 = local_290 + 1;
  } while( true );
}

Assistant:

void AddInputs(CMutableTransaction& rawTx, const UniValue& inputs_in, std::optional<bool> rbf)
{
    UniValue inputs;
    if (inputs_in.isNull()) {
        inputs = UniValue::VARR;
    } else {
        inputs = inputs_in.get_array();
    }

    for (unsigned int idx = 0; idx < inputs.size(); idx++) {
        const UniValue& input = inputs[idx];
        const UniValue& o = input.get_obj();

        Txid txid = Txid::FromUint256(ParseHashO(o, "txid"));

        const UniValue& vout_v = o.find_value("vout");
        if (!vout_v.isNum())
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, missing vout key");
        int nOutput = vout_v.getInt<int>();
        if (nOutput < 0)
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, vout cannot be negative");

        uint32_t nSequence;

        if (rbf.value_or(true)) {
            nSequence = MAX_BIP125_RBF_SEQUENCE; /* CTxIn::SEQUENCE_FINAL - 2 */
        } else if (rawTx.nLockTime) {
            nSequence = CTxIn::MAX_SEQUENCE_NONFINAL; /* CTxIn::SEQUENCE_FINAL - 1 */
        } else {
            nSequence = CTxIn::SEQUENCE_FINAL;
        }

        // set the sequence number if passed in the parameters object
        const UniValue& sequenceObj = o.find_value("sequence");
        if (sequenceObj.isNum()) {
            int64_t seqNr64 = sequenceObj.getInt<int64_t>();
            if (seqNr64 < 0 || seqNr64 > CTxIn::SEQUENCE_FINAL) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, sequence number is out of range");
            } else {
                nSequence = (uint32_t)seqNr64;
            }
        }

        CTxIn in(COutPoint(txid, nOutput), CScript(), nSequence);

        rawTx.vin.push_back(in);
    }
}